

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZCompElSide,_5>::Resize(TPZManVector<TPZCompElSide,_5> *this,int64_t newsize)

{
  long lVar1;
  ostream *poVar2;
  TPZCompElSide *pTVar3;
  TPZCompElSide *pTVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  
  if (-1 < newsize) {
    lVar5 = (this->super_TPZVec<TPZCompElSide>).fNElements;
    if (lVar5 != newsize) {
      lVar1 = (this->super_TPZVec<TPZCompElSide>).fNAlloc;
      if (lVar1 < newsize) {
        if ((ulong)newsize < 6) {
          pTVar4 = (this->super_TPZVec<TPZCompElSide>).fStore;
          pTVar3 = this->fExtAlloc;
          if (pTVar4 != pTVar3) {
            lVar1 = 0;
            if (lVar5 < 1) {
              lVar5 = lVar1;
            }
            while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
              *(undefined4 *)((long)&this->fExtAlloc[0].fSide + lVar1) =
                   *(undefined4 *)((long)&pTVar4->fSide + lVar1);
              *(undefined8 *)((long)&pTVar3->fEl + lVar1) =
                   *(undefined8 *)((long)&pTVar4->fEl + lVar1);
              lVar1 = lVar1 + 0x10;
            }
            if (pTVar4 != (TPZCompElSide *)0x0) {
              operator_delete__(pTVar4);
            }
            (this->super_TPZVec<TPZCompElSide>).fStore = pTVar3;
          }
          (this->super_TPZVec<TPZCompElSide>).fNElements = newsize;
          (this->super_TPZVec<TPZCompElSide>).fNAlloc = 0;
        }
        else {
          dVar8 = (double)lVar1 * 1.2;
          uVar6 = (long)dVar8;
          if (dVar8 < (double)newsize) {
            uVar6 = newsize;
          }
          pTVar3 = (TPZCompElSide *)operator_new__(-(ulong)(uVar6 >> 0x3c != 0) | uVar6 * 0x10);
          if (uVar6 != 0) {
            pTVar4 = pTVar3;
            do {
              pTVar4->fEl = (TPZCompEl *)0x0;
              pTVar4->fSide = -1;
              pTVar4 = pTVar4 + 1;
            } while (pTVar4 != pTVar3 + uVar6);
          }
          pTVar4 = (this->super_TPZVec<TPZCompElSide>).fStore;
          lVar1 = 0;
          if (lVar5 < 1) {
            lVar5 = lVar1;
          }
          while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
            *(undefined4 *)((long)&pTVar3->fSide + lVar1) =
                 *(undefined4 *)((long)&pTVar4->fSide + lVar1);
            *(undefined8 *)((long)&pTVar3->fEl + lVar1) =
                 *(undefined8 *)((long)&pTVar4->fEl + lVar1);
            lVar1 = lVar1 + 0x10;
          }
          if (pTVar4 != (TPZCompElSide *)0x0 && pTVar4 != this->fExtAlloc) {
            operator_delete__(pTVar4);
          }
          (this->super_TPZVec<TPZCompElSide>).fStore = pTVar3;
          (this->super_TPZVec<TPZCompElSide>).fNElements = newsize;
          (this->super_TPZVec<TPZCompElSide>).fNAlloc = uVar6;
        }
      }
      else {
        (this->super_TPZVec<TPZCompElSide>).fNElements = newsize;
      }
    }
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}